

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_object_pool.h
# Opt level: O3

pointer __thiscall
Gudhi::
Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>>
::
construct<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>const&>
          (Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>>
           *this,Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
                 *u)

{
  void *ret;
  pointer pEVar1;
  
  pEVar1 = *(pointer *)this;
  if (pEVar1 == (pointer)0x0) {
    pEVar1 = (pointer)boost::pool<boost::default_user_allocator_malloc_free>::malloc_need_resize
                                ((pool<boost::default_user_allocator_malloc_free> *)this);
    if (pEVar1 == (pointer)0x0) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Simple_object_pool.h"
                    ,0x33,
                    "pointer Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, true>>>>::construct(U &&...) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, true>>>, U = <const Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, true>>> &>]"
                   );
    }
  }
  else {
    *(node_ptr *)this =
         (pEVar1->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  }
  (pEVar1->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (pEVar1->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  pEVar1->rowIndex_ = u->rowIndex_;
  return pEVar1;
}

Assistant:

pointer construct(U&&...u) {
    void* p = base().malloc BOOST_PREVENT_MACRO_SUBSTITUTION();
    assert(p);
    try {
      new(p) T(std::forward<U>(u)...);
    }    catch (...) {
      base().free BOOST_PREVENT_MACRO_SUBSTITUTION(p);
      throw;
    }
    return static_cast<pointer> (p);
  }